

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::
     conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
               (void)

{
  bool bVar1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  int local_4c;
  __native_type local_48;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_20;
  
  local_48._16_8_ = 0;
  local_48.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_48.__align = 0;
  local_48._8_8_ = 0;
  local_48.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_20.m_head = (ControlBlock *)&DAT_0000ffef;
  local_20.m_tail = (ControlBlock *)&DAT_0000ffef;
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_48.__data);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x48);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_20);
  local_48._16_8_ = 0;
  local_48.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_48.__align = 0;
  local_48._8_8_ = 0;
  local_48.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_20.m_head = (ControlBlock *)&DAT_0000ffef;
  local_20.m_tail = (ControlBlock *)&DAT_0000ffef;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        &local_48.__data);
  local_4c = 1;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                    *)&local_48.__data,&local_4c);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_48.__data);
  if (bVar1) {
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x50);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        &local_48.__data);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_48.__data);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x53);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  clear((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        &local_48.__data);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_20);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            queue.clear();
        }
    }